

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minja.hpp
# Opt level: O0

void __thiscall
minja::MacroTemplateToken::MacroTemplateToken
          (MacroTemplateToken *this,Location *loc,SpaceHandling pre,SpaceHandling post,
          shared_ptr<minja::VariableExpr> *n,Parameters *p)

{
  Location *in_RDI;
  TemplateToken *in_R8;
  undefined8 in_R9;
  SpaceHandling in_stack_ffffffffffffffc8;
  SpaceHandling in_stack_ffffffffffffffcc;
  
  TemplateToken::TemplateToken
            (in_R8,(Type)((ulong)in_R9 >> 0x20),in_RDI,in_stack_ffffffffffffffcc,
             in_stack_ffffffffffffffc8);
  (in_RDI->source).
  super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)&PTR__MacroTemplateToken_00444268;
  std::shared_ptr<minja::VariableExpr>::shared_ptr
            ((shared_ptr<minja::VariableExpr> *)in_RDI,
             (shared_ptr<minja::VariableExpr> *)
             CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<minja::Expression>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<minja::Expression>_>_>_>
  ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<minja::Expression>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<minja::Expression>_>_>_>
            *)in_RDI,
           (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<minja::Expression>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<minja::Expression>_>_>_>
            *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  return;
}

Assistant:

MacroTemplateToken(const Location & loc, SpaceHandling pre, SpaceHandling post, std::shared_ptr<VariableExpr> && n, Expression::Parameters && p)
      : TemplateToken(Type::Macro, loc, pre, post), name(std::move(n)), params(std::move(p)) {}